

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regfileparser.cpp
# Opt level: O2

bool ProcessRegFile(string *filename,regkeymaker *mk)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  string line;
  string valuespec;
  string valuename;
  RegistryValue local_50;
  
  __stream = fopen((filename->_M_dataplus)._M_p,"r");
  if (__stream == (FILE *)0x0) {
    perror((filename->_M_dataplus)._M_p);
  }
  else {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while (bVar1 = ReadLine((FILE *)__stream,&line), bVar1) {
      while ((line._M_string_length != 0 &&
             (iVar2 = isspace((int)line._M_dataplus._M_p[line._M_string_length - 1]), iVar2 != 0)))
      {
        std::__cxx11::string::resize((ulong)&line);
      }
      stripbom(&line);
      if (((line._M_string_length != 0) && (bVar1 = std::operator==(&line,"REGEDIT4"), !bVar1)) &&
         (*line._M_dataplus._M_p != ';')) {
        if ((*line._M_dataplus._M_p == '[') &&
           (line._M_dataplus._M_p[line._M_string_length - 1] == ']')) {
          std::__cxx11::string::substr((ulong)&valuespec,(ulong)&line);
          RegistryPath::FromKeySpec((RegistryPath *)&valuename,&valuespec);
          (**mk->_vptr_regkeymaker)(mk,(RegistryPath *)&valuename);
          std::__cxx11::string::~string((string *)&valuename._M_string_length);
          std::__cxx11::string::~string((string *)&valuespec);
        }
        else {
          std::__cxx11::string::find_first_not_of((char *)&line,0x126941);
          std::__cxx11::string::erase((ulong)&line,0);
          GetNameFromSetSpec(&valuename,&line,0);
          while( true ) {
            pcVar3 = (char *)std::__cxx11::string::at((ulong)&line);
            if ((*pcVar3 != '\\') &&
               (pcVar3 = (char *)std::__cxx11::string::at((ulong)&line), *pcVar3 != ','))
            goto LAB_001165ff;
            pcVar3 = (char *)std::__cxx11::string::at((ulong)&line);
            if (*pcVar3 == '\\') {
              std::__cxx11::string::resize((ulong)&line);
              while ((line._M_string_length != 0 &&
                     (iVar2 = isspace((int)line._M_dataplus._M_p[line._M_string_length - 1]),
                     iVar2 != 0))) {
                std::__cxx11::string::resize((ulong)&line);
              }
            }
            valuespec._M_dataplus._M_p = (pointer)&valuespec.field_2;
            valuespec._M_string_length = 0;
            valuespec.field_2._M_local_buf[0] = '\0';
            bVar1 = ReadLine((FILE *)__stream,&valuespec);
            if (!bVar1) break;
            std::__cxx11::string::find_first_not_of((char *)&valuespec,0x126941);
            std::__cxx11::string::erase((ulong)&valuespec,0);
            while ((valuespec._M_string_length != 0 &&
                   (iVar2 = isspace((int)valuespec._M_dataplus._M_p[valuespec._M_string_length - 1])
                   , iVar2 != 0))) {
              std::__cxx11::string::resize((ulong)&valuespec);
            }
            std::__cxx11::string::append((string *)&line);
            std::__cxx11::string::~string((string *)&valuespec);
          }
          std::__cxx11::string::~string((string *)&valuespec);
LAB_001165ff:
          GetValueSpecFromSetSpec(&valuespec,&line,0);
          RegistryValue::FromValueSpec(&local_50,&valuespec);
          (*mk->_vptr_regkeymaker[1])(mk,(RegistryPath *)&valuename,&local_50);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_50.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          std::__cxx11::string::~string((string *)&valuespec);
          std::__cxx11::string::~string((string *)&valuename);
        }
      }
    }
    fclose(__stream);
    std::__cxx11::string::~string((string *)&line);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool ProcessRegFile(const std::string& filename, regkeymaker& mk)
{
    FILE *f= fopen(filename.c_str(), "r");
    if (f==NULL) {
        perror(filename.c_str());
        return false;
    }

    std::string line;

// note: not yet handling linecontinuations
// note: not yet handling utf-16LE encoded files
    while (ReadLine(f, line)) {
        // remove trailing whitespace
        while (line.size() && isspace(line[line.size()-1])) {
            line.resize(line.size()-1);
        }

        stripbom(line);

        if (line.size()==0)
            continue;
        else if (line=="REGEDIT4")
            continue;
        else if (line[0]=='[' && line[line.size()-1]==']') {
            mk.newkey(RegistryPath::FromKeySpec(line.substr(1, line.size()-2)));
        }
        else if (line[0]==';') {
            // skip comments.
        }
        else {
            // remove leading whitespace
            line.erase(0, line.find_first_not_of(" \t"));

            std::string valuename= GetNameFromSetSpec(line, 0);

            // note: not handling comments here: comment ending in ',' will confuse us.

            // handle line continuation
            while (line.at(line.size()-1)=='\\' || line.at(line.size()-1)==',' ) {
                // strip  backslash + whitespace
                if (line.at(line.size()-1)=='\\') {
                    line.resize(line.size()-1);
                    while (line.size() && isspace(line[line.size()-1])) {
                        line.resize(line.size()-1);
                    }
                }
                std::string continuedline;
                if (!ReadLine(f, continuedline))
                    break;
                // trim whitespace
                continuedline.erase(0, continuedline.find_first_not_of(" \t"));
                while (continuedline.size() && isspace(continuedline[continuedline.size()-1])) {
                    continuedline.resize(continuedline.size()-1);
                }

                line += continuedline;
            }
            std::string valuespec= GetValueSpecFromSetSpec(line, 0);

            //debug("valline: %hs  = %hs\n", valuename.c_str(), valuespec.c_str());

            mk.setval(valuename, RegistryValue::FromValueSpec(valuespec));
        }
    }

    fclose(f);
    return true;
}